

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

int currencyNameComparator(void *a,void *b)

{
  int local_3c;
  int local_34;
  int32_t i;
  CurrencyNameStruct *currName_2;
  CurrencyNameStruct *currName_1;
  void *b_local;
  void *a_local;
  
  local_34 = 0;
  while( true ) {
    if (*(int *)((long)a + 0x10) < *(int *)((long)b + 0x10)) {
      local_3c = *(int *)((long)a + 0x10);
    }
    else {
      local_3c = *(int *)((long)b + 0x10);
    }
    if (local_3c <= local_34) {
      if (*(int *)((long)a + 0x10) < *(int *)((long)b + 0x10)) {
        return -1;
      }
      if (*(int *)((long)b + 0x10) < *(int *)((long)a + 0x10)) {
        return 1;
      }
      return 0;
    }
    if (*(ushort *)(*(long *)((long)a + 8) + (long)local_34 * 2) <
        *(ushort *)(*(long *)((long)b + 8) + (long)local_34 * 2)) {
      return -1;
    }
    if (*(ushort *)(*(long *)((long)b + 8) + (long)local_34 * 2) <
        *(ushort *)(*(long *)((long)a + 8) + (long)local_34 * 2)) break;
    local_34 = local_34 + 1;
  }
  return 1;
}

Assistant:

static int U_CALLCONV currencyNameComparator(const void* a, const void* b) {
    const CurrencyNameStruct* currName_1 = (const CurrencyNameStruct*)a;
    const CurrencyNameStruct* currName_2 = (const CurrencyNameStruct*)b;
    for (int32_t i = 0; 
         i < MIN(currName_1->currencyNameLen, currName_2->currencyNameLen);
         ++i) {
        if (currName_1->currencyName[i] < currName_2->currencyName[i]) {
            return -1;
        }
        if (currName_1->currencyName[i] > currName_2->currencyName[i]) {
            return 1;
        }
    }
    if (currName_1->currencyNameLen < currName_2->currencyNameLen) {
        return -1;
    } else if (currName_1->currencyNameLen > currName_2->currencyNameLen) {
        return 1;
    }
    return 0;
}